

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O3

void zCompRow_to_CompCol(int m,int n,int_t nnz,doublecomplex *a,int_t *colind,int_t *rowptr,
                        doublecomplex **at,int_t **rowind,int_t **colptr)

{
  int iVar1;
  int_t *piVar2;
  doublecomplex *pdVar3;
  double dVar4;
  doublecomplex *pdVar5;
  int_t *piVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  
  pdVar5 = doublecomplexMalloc((long)nnz);
  *at = pdVar5;
  piVar6 = intMalloc(nnz);
  *rowind = piVar6;
  piVar6 = intMalloc(n + 1);
  *colptr = piVar6;
  piVar6 = intCalloc(n);
  if (0 < m) {
    iVar9 = *rowptr;
    uVar7 = 0;
    do {
      lVar10 = uVar7 + 1;
      uVar7 = uVar7 + 1;
      iVar1 = rowptr[lVar10];
      if (iVar9 < rowptr[lVar10]) {
        lVar10 = (long)iVar9;
        do {
          piVar6[colind[lVar10]] = piVar6[colind[lVar10]] + 1;
          lVar10 = lVar10 + 1;
          iVar1 = rowptr[uVar7];
        } while (lVar10 < rowptr[uVar7]);
      }
      iVar9 = iVar1;
    } while (uVar7 != (uint)m);
  }
  piVar2 = *colptr;
  *piVar2 = 0;
  if (0 < n) {
    uVar7 = 0;
    do {
      piVar2[uVar7 + 1] = piVar6[uVar7] + piVar2[uVar7];
      piVar6[uVar7] = piVar2[uVar7];
      uVar7 = uVar7 + 1;
    } while ((uint)n != uVar7);
  }
  if (0 < m) {
    iVar9 = *rowptr;
    uVar7 = 0;
    do {
      uVar8 = uVar7 + 1;
      iVar1 = rowptr[uVar7 + 1];
      if (iVar9 < rowptr[uVar7 + 1]) {
        lVar10 = (long)iVar9;
        pdVar5 = a + lVar10;
        do {
          iVar9 = colind[lVar10];
          iVar1 = piVar6[iVar9];
          (*rowind)[iVar1] = (int_t)uVar7;
          pdVar3 = *at;
          dVar4 = pdVar5->i;
          pdVar3[iVar1].r = pdVar5->r;
          pdVar3[iVar1].i = dVar4;
          piVar6[iVar9] = piVar6[iVar9] + 1;
          lVar10 = lVar10 + 1;
          pdVar5 = pdVar5 + 1;
          iVar1 = rowptr[uVar8];
        } while (lVar10 < rowptr[uVar8]);
      }
      iVar9 = iVar1;
      uVar7 = uVar8;
    } while (uVar8 != (uint)m);
  }
  superlu_free(piVar6);
  return;
}

Assistant:

void
zCompRow_to_CompCol(int m, int n, int_t nnz, 
		    doublecomplex *a, int_t *colind, int_t *rowptr,
		    doublecomplex **at, int_t **rowind, int_t **colptr)
{
    register int i, j, col, relpos;
    int_t *marker;

    /* Allocate storage for another copy of the matrix. */
    *at = (doublecomplex *) doublecomplexMalloc(nnz);
    *rowind = (int_t *) intMalloc(nnz);
    *colptr = (int_t *) intMalloc(n+1);
    marker = (int_t *) intCalloc(n);
    
    /* Get counts of each column of A, and set up column pointers */
    for (i = 0; i < m; ++i)
	for (j = rowptr[i]; j < rowptr[i+1]; ++j) ++marker[colind[j]];
    (*colptr)[0] = 0;
    for (j = 0; j < n; ++j) {
	(*colptr)[j+1] = (*colptr)[j] + marker[j];
	marker[j] = (*colptr)[j];
    }

    /* Transfer the matrix into the compressed column storage. */
    for (i = 0; i < m; ++i) {
	for (j = rowptr[i]; j < rowptr[i+1]; ++j) {
	    col = colind[j];
	    relpos = marker[col];
	    (*rowind)[relpos] = i;
	    (*at)[relpos] = a[j];
	    ++marker[col];
	}
    }

    SUPERLU_FREE(marker);
}